

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_71cb::StatePointer_ArrowOp_Test::StatePointer_ArrowOp_Test
          (StatePointer_ArrowOp_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0015a2a8;
  return;
}

Assistant:

TEST(StatePointer, ArrowOp) {
	Foo foo1{42};
	Foo foo2{1337};
	state_ptr<Foo> p1a{&foo1, 1};
	state_ptr<Foo> p1b{&foo1, 1};
	state_ptr<Foo> p2 {&foo2, 1};
	EXPECT_EQ(p1a->get_a(), p1b->get_a());
	EXPECT_NE(p1a->get_a(), p2->get_a());
	EXPECT_NE(p1b->get_a(), p2->get_a());
}